

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O2

bool __thiscall llvm::Triple::operator==(Triple *this,Triple *Other)

{
  int iVar1;
  
  iVar1 = memcmp(&this->Arch,&Other->Arch,0x18);
  return iVar1 == 0;
}

Assistant:

bool operator==(const Triple &Other) const {
    return Arch == Other.Arch && SubArch == Other.SubArch &&
           Vendor == Other.Vendor && OS == Other.OS &&
           Environment == Other.Environment &&
           ObjectFormat == Other.ObjectFormat;
  }